

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

bool __thiscall
ON_OffsetSurfaceFunction::SetOffsetPoint
          (ON_OffsetSurfaceFunction *this,double s,double t,double distance,double radius)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  ON_OffsetSurfaceValue *pOVar4;
  double local_90;
  int local_7c;
  undefined1 auStack_78 [4];
  int i;
  ON_OffsetSurfaceValue offset_value;
  double v;
  double dTol;
  double u;
  bool rc;
  double radius_local;
  double distance_local;
  double t_local;
  double s_local;
  ON_OffsetSurfaceFunction *this_local;
  
  u._7_1_ = false;
  bVar1 = ON_IsValid(s);
  if ((((bVar1) && (bVar1 = ON_IsValid(t), bVar1)) && (bVar1 = ON_IsValid(distance), bVar1)) &&
     (bVar1 = ON_IsValid(radius), bVar1)) {
    dTol = ON_Interval::NormalizedParameterAt((ON_Interval *)&this->field_0x8,s);
    t_local = s;
    if (dTol < 1.490116119385e-08) {
      pdVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,0);
      t_local = *pdVar3;
      dTol = 0.0;
    }
    if (0.9999999850988388 < dTol) {
      pdVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,1);
      t_local = *pdVar3;
      dTol = 1.0;
    }
    offset_value._32_8_ = ON_Interval::NormalizedParameterAt((ON_Interval *)&this->field_0x18,t);
    distance_local = t;
    if ((double)offset_value._32_8_ < 1.490116119385e-08) {
      pdVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,0);
      distance_local = *pdVar3;
      offset_value.m_index = 0;
      offset_value._36_4_ = 0;
    }
    if (0.9999999850988388 < (double)offset_value._32_8_) {
      pdVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,1);
      distance_local = *pdVar3;
      offset_value.m_index = 0;
      offset_value._36_4_ = 0x3ff00000;
    }
    if (((0.0 <= dTol) && (dTol <= 1.0)) &&
       ((0.0 <= (double)offset_value._32_8_ && ((double)offset_value._32_8_ <= 1.0)))) {
      ON_OffsetSurfaceValue::ON_OffsetSurfaceValue((ON_OffsetSurfaceValue *)auStack_78);
      _auStack_78 = t_local;
      offset_value.m_s = distance_local;
      local_90 = radius;
      if (radius <= 0.0) {
        local_90 = 0.0;
      }
      offset_value.m_distance = local_90;
      offset_value.m_radius._0_4_ = (int)(((double)offset_value._32_8_ * 4096.0 + dTol) * 4096.0);
      offset_value.m_t = distance;
      for (local_7c = 0; iVar2 = ON_SimpleArray<ON_OffsetSurfaceValue>::Count(&this->m_offset_value)
          , local_7c < iVar2; local_7c = local_7c + 1) {
        pOVar4 = ON_SimpleArray<ON_OffsetSurfaceValue>::operator[](&this->m_offset_value,local_7c);
        if (pOVar4->m_index == offset_value.m_radius._0_4_) {
          pOVar4 = ON_SimpleArray<ON_OffsetSurfaceValue>::operator[](&this->m_offset_value,local_7c)
          ;
          memcpy(pOVar4,auStack_78,0x24);
          break;
        }
      }
      iVar2 = ON_SimpleArray<ON_OffsetSurfaceValue>::Count(&this->m_offset_value);
      if (local_7c == iVar2) {
        ON_SimpleArray<ON_OffsetSurfaceValue>::Append
                  (&this->m_offset_value,(ON_OffsetSurfaceValue *)auStack_78);
        ON_SimpleArray<ON_BumpFunction>::SetCount(&this->m_bumps,0);
        this->m_bValid = false;
      }
      u._7_1_ = true;
    }
  }
  return u._7_1_;
}

Assistant:

bool ON_OffsetSurfaceFunction::SetOffsetPoint(
  double s,
  double t,
  double distance,
  double radius
  )
{
  bool rc = false;
  if ( ON_IsValid(s) && ON_IsValid(t) && ON_IsValid(distance) && ON_IsValid(radius) )
  {
    double u = m_domain[0].NormalizedParameterAt(s);

    // 14 Jan 2008, Mikko, TRR 29861:
    // Changing the clamping to happen when the 
    // point is outside or nearly outside the domain.
    const double dTol = ON_SQRT_EPSILON; // tiny border around untrimmed edges

    if ( u < dTol)
    {
      s = m_domain[0][0];
      u = 0.0;
    }
    if ( u > 1.0-dTol)
    {
      s = m_domain[0][1];
      u = 1.0;
    }

    double v = m_domain[1].NormalizedParameterAt(t);
    if ( v < dTol)
    {
      t = m_domain[1][0];
      v = 0.0;
    }
    if ( v > 1.0-dTol)
    {
      t = m_domain[1][1];
      v = 1.0;
    }

    if ( u >= 0.0 && u <= 1.0 && v >= 0.0 && v <= 1.0 )
    {
      ON_OffsetSurfaceValue offset_value;
      offset_value.m_s = s;
      offset_value.m_t = t;
      offset_value.m_distance = distance;
      offset_value.m_radius = (radius > 0.0) ? radius : 0.0;
      offset_value.m_index = (int)((u + v*4096.0)*4096.0);
      int i;
      for ( i = 0; i < m_offset_value.Count(); i++ )
      {
        if ( m_offset_value[i].m_index == offset_value.m_index )
        {
          m_offset_value[i] = offset_value;
          break;
        }
      }
      if (i == m_offset_value.Count())
      {
        m_offset_value.Append(offset_value);
        m_bumps.SetCount(0);
        m_bValid = false;
      }
      rc = true;
    }
  }
  return rc;
}